

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O0

OPJ_BOOL opj_t2_encode_packets
                   (opj_t2_t *p_t2,OPJ_UINT32 p_tile_no,opj_tcd_tile_t *p_tile,
                   OPJ_UINT32 p_maxlayers,OPJ_BYTE *p_dest,OPJ_UINT32 *p_data_written,
                   OPJ_UINT32 p_max_len,opj_codestream_info_t *cstr_info,OPJ_UINT32 p_tp_num,
                   OPJ_INT32 p_tp_pos,OPJ_UINT32 p_pino,J2K_T2_MODE p_t2_mode)

{
  opj_cp_t *p_cp;
  opj_tile_info_t *poVar1;
  uint uVar2;
  OPJ_UINT32 p_nb_elements;
  OPJ_BOOL OVar3;
  opj_tcp_t *tcp;
  opj_pi_iterator_t *pi;
  opj_pi_iterator_t *pi_00;
  opj_packet_info_t *poVar4;
  long local_b8;
  uint local_ac;
  opj_packet_info_t *info_PK;
  opj_tile_info_t *info_TL;
  uint local_90;
  OPJ_UINT32 l_tp_num;
  OPJ_UINT32 l_comp_len;
  OPJ_UINT32 l_nb_pocs;
  OPJ_UINT32 l_max_comp;
  OPJ_UINT32 pocno;
  opj_tcp_t *l_tcp;
  opj_cp_t *l_cp;
  opj_image_t *l_image;
  opj_pi_iterator_t *l_current_pi;
  opj_pi_iterator_t *l_pi;
  uint local_50;
  OPJ_UINT32 poc;
  OPJ_UINT32 compno;
  OPJ_UINT32 l_nb_bytes;
  OPJ_BYTE *l_current_data;
  OPJ_UINT32 *p_data_written_local;
  OPJ_BYTE *p_dest_local;
  opj_tcd_tile_t *poStack_28;
  OPJ_UINT32 p_maxlayers_local;
  opj_tcd_tile_t *p_tile_local;
  opj_t2_t *poStack_18;
  OPJ_UINT32 p_tile_no_local;
  opj_t2_t *p_t2_local;
  
  poc = 0;
  p_cp = p_t2->cp;
  tcp = p_cp->tcps + p_tile_no;
  uVar2 = 1;
  if (p_cp->rsiz == 4) {
    uVar2 = 2;
  }
  if ((p_cp->m_specific_param).m_dec.m_reduce == 0) {
    local_ac = 1;
  }
  else {
    local_ac = p_t2->image->numcomps;
  }
  p_nb_elements = tcp->numpocs + 1;
  _compno = p_dest;
  l_current_data = (OPJ_BYTE *)p_data_written;
  p_data_written_local = (OPJ_UINT32 *)p_dest;
  p_dest_local._4_4_ = p_maxlayers;
  poStack_28 = p_tile;
  p_tile_local._4_4_ = p_tile_no;
  poStack_18 = p_t2;
  pi = opj_pi_initialise_encode(p_t2->image,p_cp,p_tile_no,p_t2_mode);
  if (pi == (opj_pi_iterator_t *)0x0) {
    p_t2_local._4_4_ = 0;
  }
  else {
    l_current_data[0] = '\0';
    l_current_data[1] = '\0';
    l_current_data[2] = '\0';
    l_current_data[3] = '\0';
    if (p_t2_mode == THRESH_CALC) {
      for (local_50 = 0; local_50 < local_ac; local_50 = local_50 + 1) {
        local_90 = 0;
        l_image = (opj_image_t *)pi;
        for (l_pi._4_4_ = 0; l_pi._4_4_ < uVar2; l_pi._4_4_ = l_pi._4_4_ + 1) {
          opj_pi_create_encode(pi,p_cp,p_tile_local._4_4_,l_pi._4_4_,local_50,p_tp_pos,THRESH_CALC);
          if (l_image[1].icc_profile_len == 0xffffffff) {
            opj_pi_destroy(pi,p_nb_elements);
            return 0;
          }
          while (OVar3 = opj_pi_next((opj_pi_iterator_t *)l_image), OVar3 != 0) {
            if (*(uint *)&l_image->field_0x2c < p_dest_local._4_4_) {
              poc = 0;
              OVar3 = opj_t2_encode_packet
                                (p_tile_local._4_4_,poStack_28,tcp,(opj_pi_iterator_t *)l_image,
                                 _compno,&poc,p_max_len,cstr_info);
              if (OVar3 == 0) {
                opj_pi_destroy(pi,p_nb_elements);
                return 0;
              }
              local_90 = poc + local_90;
              _compno = _compno + poc;
              p_max_len = p_max_len - poc;
              *(OPJ_UINT32 *)l_current_data = poc + *(int *)l_current_data;
            }
          }
          if (((p_cp->m_specific_param).m_dec.m_reduce != 0) &&
             ((p_cp->m_specific_param).m_dec.m_reduce < local_90)) {
            opj_pi_destroy(pi,p_nb_elements);
            return 0;
          }
          l_image = (opj_image_t *)&l_image[5].x1;
        }
      }
    }
    else {
      opj_pi_create_encode(pi,p_cp,p_tile_local._4_4_,p_pino,p_tp_num,p_tp_pos,p_t2_mode);
      pi_00 = pi + p_pino;
      if ((pi_00->poc).prg == OPJ_PROG_UNKNOWN) {
        opj_pi_destroy(pi,p_nb_elements);
        return 0;
      }
      while (OVar3 = opj_pi_next(pi_00), OVar3 != 0) {
        if (pi_00->layno < p_dest_local._4_4_) {
          poc = 0;
          OVar3 = opj_t2_encode_packet
                            (p_tile_local._4_4_,poStack_28,tcp,pi_00,_compno,&poc,p_max_len,
                             cstr_info);
          if (OVar3 == 0) {
            opj_pi_destroy(pi,p_nb_elements);
            return 0;
          }
          _compno = _compno + poc;
          p_max_len = p_max_len - poc;
          *(OPJ_UINT32 *)l_current_data = poc + *(int *)l_current_data;
          if (cstr_info != (opj_codestream_info_t *)0x0) {
            if (cstr_info->index_write != 0) {
              poVar1 = cstr_info->tile;
              poVar4 = poVar1[p_tile_local._4_4_].packet + cstr_info->packno;
              if (cstr_info->packno == 0) {
                poVar4->start_pos = (long)(poVar1[p_tile_local._4_4_].end_header + 1);
              }
              else {
                if (((*(byte *)((long)&p_cp->m_specific_param + 0x11) >> 3 & 1) == 0 &&
                     ((byte)tcp->field_0x1638 >> 2 & 1) == 0) || (poVar4->start_pos == 0)) {
                  local_b8 = poVar1[p_tile_local._4_4_].packet[cstr_info->packno + -1].end_pos + 1;
                }
                else {
                  local_b8 = poVar4->start_pos;
                }
                poVar4->start_pos = local_b8;
              }
              poVar4->end_pos = poVar4->start_pos + (ulong)poc + -1;
              poVar4->end_ph_pos = poVar4->start_pos + -1 + poVar4->end_ph_pos;
            }
            cstr_info->packno = cstr_info->packno + 1;
          }
          poStack_28->packno = poStack_28->packno + 1;
        }
      }
    }
    opj_pi_destroy(pi,p_nb_elements);
    p_t2_local._4_4_ = 1;
  }
  return p_t2_local._4_4_;
}

Assistant:

OPJ_BOOL opj_t2_encode_packets( opj_t2_t* p_t2,
                                OPJ_UINT32 p_tile_no,
                                opj_tcd_tile_t *p_tile,
                                OPJ_UINT32 p_maxlayers,
                                OPJ_BYTE *p_dest,
                                OPJ_UINT32 * p_data_written,
                                OPJ_UINT32 p_max_len,
                                opj_codestream_info_t *cstr_info,
                                OPJ_UINT32 p_tp_num,
                                OPJ_INT32 p_tp_pos,
                                OPJ_UINT32 p_pino,
                                J2K_T2_MODE p_t2_mode)
{
        OPJ_BYTE *l_current_data = p_dest;
        OPJ_UINT32 l_nb_bytes = 0;
        OPJ_UINT32 compno;
        OPJ_UINT32 poc;
        opj_pi_iterator_t *l_pi = 00;
        opj_pi_iterator_t *l_current_pi = 00;
        opj_image_t *l_image = p_t2->image;
        opj_cp_t *l_cp = p_t2->cp;
        opj_tcp_t *l_tcp = &l_cp->tcps[p_tile_no];
        OPJ_UINT32 pocno = (l_cp->rsiz == OPJ_PROFILE_CINEMA_4K)? 2: 1;
        OPJ_UINT32 l_max_comp = l_cp->m_specific_param.m_enc.m_max_comp_size > 0 ? l_image->numcomps : 1;
        OPJ_UINT32 l_nb_pocs = l_tcp->numpocs + 1;

        l_pi = opj_pi_initialise_encode(l_image, l_cp, p_tile_no, p_t2_mode);
        if (!l_pi) {
                return OPJ_FALSE;
        }

        * p_data_written = 0;

        if (p_t2_mode == THRESH_CALC ){ /* Calculating threshold */
                l_current_pi = l_pi;

                for     (compno = 0; compno < l_max_comp; ++compno) {
                        OPJ_UINT32 l_comp_len = 0;
                        l_current_pi = l_pi;

                        for (poc = 0; poc < pocno ; ++poc) {
                                OPJ_UINT32 l_tp_num = compno;

                                /* TODO MSD : check why this function cannot fail (cf. v1) */
                                opj_pi_create_encode(l_pi, l_cp,p_tile_no,poc,l_tp_num,p_tp_pos,p_t2_mode);

                                if (l_current_pi->poc.prg == OPJ_PROG_UNKNOWN) {
                                    /* TODO ADE : add an error */
                                    opj_pi_destroy(l_pi, l_nb_pocs);
                                    return OPJ_FALSE;
                                }
                                while (opj_pi_next(l_current_pi)) {
                                        if (l_current_pi->layno < p_maxlayers) {
                                                l_nb_bytes = 0;

                                                if (! opj_t2_encode_packet(p_tile_no,p_tile, l_tcp, l_current_pi, l_current_data, &l_nb_bytes, p_max_len, cstr_info)) {
                                                        opj_pi_destroy(l_pi, l_nb_pocs);
                                                        return OPJ_FALSE;
                                                }

                                                l_comp_len += l_nb_bytes;
                                                l_current_data += l_nb_bytes;
                                                p_max_len -= l_nb_bytes;

                                                * p_data_written += l_nb_bytes;
                                        }
                                }

                                if (l_cp->m_specific_param.m_enc.m_max_comp_size) {
                                        if (l_comp_len > l_cp->m_specific_param.m_enc.m_max_comp_size) {
                                                opj_pi_destroy(l_pi, l_nb_pocs);
                                                return OPJ_FALSE;
                                        }
                                }

                                ++l_current_pi;
                        }
                }
        }
        else {  /* t2_mode == FINAL_PASS  */
                opj_pi_create_encode(l_pi, l_cp,p_tile_no,p_pino,p_tp_num,p_tp_pos,p_t2_mode);

                l_current_pi = &l_pi[p_pino];
                if (l_current_pi->poc.prg == OPJ_PROG_UNKNOWN) {
                    /* TODO ADE : add an error */
                    opj_pi_destroy(l_pi, l_nb_pocs);
                    return OPJ_FALSE;
                }
                while (opj_pi_next(l_current_pi)) {
                        if (l_current_pi->layno < p_maxlayers) {
                                l_nb_bytes=0;

                                if (! opj_t2_encode_packet(p_tile_no,p_tile, l_tcp, l_current_pi, l_current_data, &l_nb_bytes, p_max_len, cstr_info)) {
                                        opj_pi_destroy(l_pi, l_nb_pocs);
                                        return OPJ_FALSE;
                                }

                                l_current_data += l_nb_bytes;
                                p_max_len -= l_nb_bytes;

                                * p_data_written += l_nb_bytes;

                                /* INDEX >> */
                                if(cstr_info) {
                                        if(cstr_info->index_write) {
                                                opj_tile_info_t *info_TL = &cstr_info->tile[p_tile_no];
                                                opj_packet_info_t *info_PK = &info_TL->packet[cstr_info->packno];
                                                if (!cstr_info->packno) {
                                                        info_PK->start_pos = info_TL->end_header + 1;
                                                } else {
                                                        info_PK->start_pos = ((l_cp->m_specific_param.m_enc.m_tp_on | l_tcp->POC)&& info_PK->start_pos) ? info_PK->start_pos : info_TL->packet[cstr_info->packno - 1].end_pos + 1;
                                                }
                                                info_PK->end_pos = info_PK->start_pos + l_nb_bytes - 1;
                                                info_PK->end_ph_pos += info_PK->start_pos - 1;  /* End of packet header which now only represents the distance
                                                                                                                                                                                                                                                   to start of packet is incremented by value of start of packet*/
                                        }

                                        cstr_info->packno++;
                                }
                                /* << INDEX */
                                ++p_tile->packno;
                        }
                }
        }

        opj_pi_destroy(l_pi, l_nb_pocs);

        return OPJ_TRUE;
}